

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.cpp
# Opt level: O1

void sigtrap_handler(int code,siginfo_t *siginfo,void *context)

{
  native_context_t *ucontext;
  DWORD local_d0 [2];
  EXCEPTION_RECORD record;
  EXCEPTION_POINTERS pointers;
  
  if (0 < init_count.m_val) {
    local_d0[0] = CONTEXTGetExceptionCodeForSignal(siginfo,(native_context_t *)context);
    local_d0[1] = 0x100;
    record.ExceptionCode = 0;
    record.ExceptionFlags = 0;
    record.ExceptionRecord = (_EXCEPTION_RECORD *)GetNativeContextPC((native_context_t *)context);
    record.ExceptionAddress._0_4_ = 0;
    record.ExceptionInformation[0xe] = (ULONG_PTR)local_d0;
    common_signal_handler
              ((PEXCEPTION_POINTERS)(record.ExceptionInformation + 0xe),code,
               (native_context_t *)context);
  }
  if ((PAL_InitializeChakraCoreCalled != false) &&
     (g_previous_sigtrap.__sigaction_handler.sa_handler != (__sighandler_t)0x0)) {
    (*g_previous_sigtrap.__sigaction_handler.sa_handler)(code);
    return;
  }
  abort();
}

Assistant:

static void sigtrap_handler(int code, siginfo_t *siginfo, void *context)
{
    if (PALIsInitialized())
    {
        EXCEPTION_RECORD record;
        EXCEPTION_POINTERS pointers;
        native_context_t *ucontext;

        ucontext = (native_context_t *)context;

        record.ExceptionCode = CONTEXTGetExceptionCodeForSignal(siginfo, ucontext);
        record.ExceptionFlags = EXCEPTION_IS_SIGNAL;
        record.ExceptionRecord = NULL;
        record.ExceptionAddress = GetNativeContextPC(ucontext);
        record.NumberParameters = 0;

        pointers.ExceptionRecord = &record;

        common_signal_handler(&pointers, code, ucontext);
    }

    TRACE("SIGTRAP signal was unhandled; chaining to previous sigaction\n");

    if (g_previous_sigtrap.sa_sigaction != NULL)
    {
        g_previous_sigtrap.sa_sigaction(code, siginfo, context);
    }
    else
    {
        // We abort instead of restore the original or default handler and returning
        // because returning from a SIGTRAP handler continues execution past the trap.
        abort();
    }
}